

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task20.cpp
# Opt level: O2

void bubble_sort(int *arr,int size)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int unsort_size;
  long lVar4;
  int __tmp;
  
  lVar2 = (long)size;
  while (lVar3 = lVar2, lVar4 = 1, lVar3 != 0) {
    for (; lVar2 = lVar3 + -1, lVar4 < lVar3; lVar4 = lVar4 + 1) {
      iVar1 = arr[lVar4 + -1];
      if (arr[lVar4] < iVar1) {
        arr[lVar4 + -1] = arr[lVar4];
        arr[lVar4] = iVar1;
      }
    }
  }
  return;
}

Assistant:

void bubble_sort (int* arr, int size){
    for (int unsort_size = size; unsort_size; unsort_size--)
        for (int ind1 = 1, ind2 = 0; ind1 < unsort_size; ind1++, ind2++)
            if (arr[ind2] > arr[ind1]) swap(arr[ind2], arr[ind1]);
}